

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O1

int __thiscall
Imf_2_5::TypedAttribute<std::vector<float,_std::allocator<float>_>_>::copy
          (TypedAttribute<std::vector<float,_std::allocator<float>_>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  Attribute *this_00;
  TypedAttribute<std::vector<float,_std::allocator<float>_>_> *pTVar1;
  
  this_00 = (Attribute *)operator_new(0x20);
  this_00->_vptr_Attribute = (_func_int **)0x0;
  this_00[1]._vptr_Attribute = (_func_int **)0x0;
  this_00[2]._vptr_Attribute = (_func_int **)0x0;
  this_00[3]._vptr_Attribute = (_func_int **)0x0;
  Attribute::Attribute(this_00);
  this_00->_vptr_Attribute = (_func_int **)&PTR__TypedAttribute_0300c208;
  this_00[1]._vptr_Attribute = (_func_int **)0x0;
  this_00[2]._vptr_Attribute = (_func_int **)0x0;
  this_00[3]._vptr_Attribute = (_func_int **)0x0;
  pTVar1 = cast(&this->super_Attribute);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)(this_00 + 1),&pTVar1->_value);
  return (int)this_00;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}